

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalDeclarationStatement.h
# Opt level: O2

void __thiscall LocalDeclarationStatement::execute(LocalDeclarationStatement *this,Environment *env)

{
  element_type *peVar1;
  ptr<Value> value;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar1->_vptr_Expression)(&local_38,peVar1,env);
  std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_48,&local_38);
  Environment::putValue(env,&this->identifier,Public,(ptr<Value> *)&_Stack_48,this->constant);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> value = expression->evaluate(env);
        env -> putValue(identifier, Scope::Public, value, constant);
    }